

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O1

void __thiscall Time::~Time(Time *this)

{
  pointer ppEVar1;
  pointer ppTVar2;
  
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Time_0015f720;
  ppEVar1 = (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar1 != (pointer)0x0) {
    operator_delete(ppEVar1,(long)(this->timeEstimators).
                                  super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar1)
    ;
  }
  ppTVar2 = (this->timeObjects).
            super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar2 != (pointer)0x0) {
    operator_delete(ppTVar2,(long)(this->timeObjects).
                                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar2
                   );
  }
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

virtual ~Time(){}